

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O1

int __thiscall Centaurus::PriorityChain::compare(PriorityChain *this,PriorityChain *chain)

{
  Identifier *this_00;
  Identifier *id;
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  int in_EAX;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = 0xffffffffffffffff;
  lVar6 = 0;
  do {
    pPVar1 = (this->
             super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
             ).
             super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->
                   super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                   ).
                   super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4) *
            -0x5555555555555555;
    pPVar2 = (chain->
             super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
             ).
             super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(chain->
                   super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                   ).
                   super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 4) *
            -0x5555555555555555;
    if (uVar7 <= uVar4) {
      uVar4 = uVar7;
    }
    uVar8 = uVar8 + 1;
    if (uVar4 <= uVar8) {
      return 0;
    }
    this_00 = (Identifier *)((long)&(pPVar1->m_id)._vptr_Identifier + lVar6);
    id = (Identifier *)((long)&(pPVar2->m_id)._vptr_Identifier + lVar6);
    bVar3 = Identifier::operator==(this_00,id);
    if (((bVar3) &&
        (*(int *)((long)&pPVar1->m_index + lVar6) == *(int *)((long)&pPVar2->m_index + lVar6))) &&
       (*(int *)((long)&pPVar1->m_priority + lVar6) < *(int *)((long)&pPVar2->m_priority + lVar6)))
    {
      in_EAX = -1;
      bVar5 = false;
    }
    else {
      bVar3 = Identifier::operator==(this_00,id);
      if (bVar3) {
        if (*(int *)((long)&pPVar1->m_index + lVar6) == *(int *)((long)&pPVar2->m_index + lVar6)) {
          bVar3 = *(int *)((long)&pPVar2->m_priority + lVar6) <
                  *(int *)((long)&pPVar1->m_priority + lVar6);
        }
        else {
          bVar3 = false;
        }
      }
      else {
        bVar3 = false;
      }
      bVar5 = (bool)(bVar3 ^ 1);
      if (bVar3) {
        in_EAX = 1;
      }
    }
    lVar6 = lVar6 + 0x30;
  } while (bVar5);
  return in_EAX;
}

Assistant:

int compare(const PriorityChain& chain) const
    {
        for (int i = 0; i < std::min(size(), chain.size()); i++)
        {
            const PriorityChainElement& p = this->operator[](i);
            const PriorityChainElement& q = chain[i];

            if (p < q) return -1;
            if (p > q) return +1;
        }
        return 0;
    }